

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

void __thiscall smf::MidiFile::makeDeltaTicks(MidiFile *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MidiEvent *pMVar6;
  long *plVar7;
  ostream *poVar8;
  ulong uVar9;
  
  if (this->m_theTimeState != 0) {
    uVar2 = (uint)((ulong)((long)(this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_events).
                                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (0 < (int)uVar2) {
      uVar9 = 0;
      do {
        iVar3 = MidiEventList::size((this->m_events).
                                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar9]);
        if (0 < iVar3) {
          pMVar6 = MidiEventList::operator[]
                             ((this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar9],0);
          iVar3 = pMVar6->tick;
          iVar4 = MidiEventList::size((this->m_events).
                                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar9]);
          if (1 < iVar4) {
            iVar4 = 1;
            do {
              pMVar6 = MidiEventList::operator[]
                                 ((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar9],iVar4);
              iVar1 = pMVar6->tick;
              iVar3 = iVar1 - iVar3;
              if (iVar3 < 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Error: negative delta tick value: ",0x22);
                plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
                std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
                std::ostream::put((char)plVar7);
                poVar8 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"Timestamps must be sorted first",0x1f);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8," (use MidiFile::sortTracks() before writing).",0x2d);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                std::ostream::put((char)poVar8);
                std::ostream::flush();
              }
              pMVar6 = MidiEventList::operator[]
                                 ((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar9],iVar4);
              pMVar6->tick = iVar3;
              iVar4 = iVar4 + 1;
              iVar5 = MidiEventList::size((this->m_events).
                                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar9]);
              iVar3 = iVar1;
            } while (iVar4 < iVar5);
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uVar2 & 0x7fffffff));
    }
    this->m_theTimeState = 0;
  }
  return;
}

Assistant:

void MidiFile::makeDeltaTicks(void) {
	if (getTickState() == TIME_STATE_DELTA) {
		return;
	}
	int i, j;
	int temp;
	int length = getNumTracks();
	int *timedata = new int[length];
	for (i=0; i<length; i++) {
		timedata[i] = 0;
		if (m_events[i]->size() > 0) {
			timedata[i] = (*m_events[i])[0].tick;
		} else {
			continue;
		}
		for (j=1; j<(int)m_events[i]->size(); j++) {
			temp = (*m_events[i])[j].tick;
			int deltatick = temp - timedata[i];
			if (deltatick < 0) {
				std::cerr << "Error: negative delta tick value: " << deltatick << std::endl
				     << "Timestamps must be sorted first"
				     << " (use MidiFile::sortTracks() before writing)." << std::endl;
			}
			(*m_events[i])[j].tick = deltatick;
			timedata[i] = temp;
		}
	}
	m_theTimeState = TIME_STATE_DELTA;
	delete [] timedata;
}